

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_col,int len)

{
  Dring *pDVar1;
  int iVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  byte bVar13;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> cStack_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar13 = 0;
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar6 = len - (this->u).col.max[p_col];
    if ((this->u).col.size - (this->u).col.used < iVar6) {
      packColumns(this);
      iVar6 = len - (this->u).col.max[p_col];
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)(this->u).col.used,(type *)0x0);
      if (&local_138 != &(this->colMemMult).m_backend) {
        pnVar10 = &this->colMemMult;
        pcVar11 = &local_138;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + (ulong)bVar13 * -8 + 4);
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
        }
        local_138.exp = (this->colMemMult).m_backend.exp;
        local_138.neg = (this->colMemMult).m_backend.neg;
        local_138.fpclass = (this->colMemMult).m_backend.fpclass;
        local_138.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_138,&cStack_1b8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)len,(type *)0x0);
      pcVar11 = &local_138;
      pcVar12 = &local_b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar13 * -8 + 4);
      }
      local_b0.exp = local_138.exp;
      local_b0.neg = local_138.neg;
      local_b0.fpclass = local_138.fpclass;
      local_b0.prec_elem = local_138.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&cStack_1b8);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&cStack_1b8,(long)(this->u).col.size,(type *)0x0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&cStack_1b8);
        if ((0 < iVar7) && (iVar7 = len + (this->u).col.used * 2, (this->u).col.size < iVar7)) {
          (this->u).col.size = iVar7;
          spx_realloc<int*>(&(this->u).col.idx,iVar7);
        }
      }
    }
    piVar9 = &(this->u).col.used;
    *piVar9 = *piVar9 + iVar6;
    (this->u).col.max[p_col] = len;
  }
  else {
    if ((this->u).col.size - (this->u).col.used < len) {
      packColumns(this);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)(this->u).col.used,(type *)0x0);
      if (&local_138 != &(this->colMemMult).m_backend) {
        pnVar10 = &this->colMemMult;
        pcVar11 = &local_138;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + (ulong)bVar13 * -8 + 4);
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
        }
        local_138.exp = (this->colMemMult).m_backend.exp;
        local_138.neg = (this->colMemMult).m_backend.neg;
        local_138.fpclass = (this->colMemMult).m_backend.fpclass;
        local_138.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_138,&cStack_1b8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)len,(type *)0x0);
      pcVar11 = &local_138;
      pcVar12 = &local_b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar13 * -8 + 4);
      }
      local_b0.exp = local_138.exp;
      local_b0.neg = local_138.neg;
      local_b0.fpclass = local_138.fpclass;
      local_b0.prec_elem = local_138.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&cStack_1b8);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&cStack_1b8,(long)(this->u).col.size,(type *)0x0);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&cStack_1b8);
        if ((0 < iVar6) && (iVar6 = len + (this->u).col.used * 2, (this->u).col.size < iVar6)) {
          (this->u).col.size = iVar6;
          spx_realloc<int*>(&(this->u).col.idx,iVar6);
        }
      }
    }
    iVar6 = (this->u).col.used;
    piVar9 = (this->u).col.start;
    iVar7 = piVar9[p_col];
    lVar8 = (long)iVar7;
    iVar2 = (this->u).col.len[p_col];
    piVar9[p_col] = iVar6;
    (this->u).col.used = iVar6 + len;
    piVar9 = (this->u).col.max;
    pDVar1 = (this->u).col.elem + p_col;
    pDVar3 = pDVar1->prev;
    piVar9[pDVar3->idx] = piVar9[pDVar3->idx] + piVar9[p_col];
    piVar9[p_col] = len;
    pDVar4 = pDVar1->next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).col.list.prev;
    pDVar4 = pDVar3->next;
    pDVar1->next = pDVar4;
    pDVar4->prev = pDVar1;
    pDVar1->prev = pDVar3;
    pDVar3->next = pDVar1;
    if (0 < iVar2) {
      piVar5 = (this->u).col.idx;
      piVar9 = piVar5 + iVar6;
      do {
        *piVar9 = piVar5[lVar8];
        lVar8 = lVar8 + 1;
        piVar9 = piVar9 + 1;
      } while (lVar8 < iVar2 + iVar7);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}